

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNNNUn.cpp
# Opt level: O0

void __thiscall NaPNNNUnit::push_nn(NaPNNNUnit *this)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  NaNNUnit *in_RDI;
  NaDynAr<NaNNUnit> *unaff_retaddr;
  
  if ((in_RDI->field_0x118 & 1) != 0) {
    if (*(int *)&in_RDI->field_0x120 == 0) {
      NaDynAr<NaNNUnit>::addh(unaff_retaddr,in_RDI);
    }
    else {
      *(int *)&in_RDI->field_0x120 = *(int *)&in_RDI->field_0x120 + -1;
    }
  }
  uVar1 = (*(in_RDI->super_NaUnit).super_NaLogging._vptr_NaLogging[3])();
  if ((uVar1 & 1) != 0) {
    pcVar2 = NaPetriNode::name((NaPetriNode *)in_RDI);
    pcVar3 = NaConfigPart::GetInstance((NaConfigPart *)(*(long *)&in_RDI->field_0x110 + 0x20));
    uVar1 = NaDynAr<NaNNUnit>::count((NaDynAr<NaNNUnit> *)&in_RDI->field_0x128);
    NaPrintLog("NaPNNNUnit::push_nn(%p, %s[%s]) --> %u items stored\n",in_RDI,pcVar2,pcVar3,
               (ulong)uVar1);
  }
  return;
}

Assistant:

void
NaPNNNUnit::push_nn ()
{
    if(need_deck) {
	if(skip_rest > 0){
	    --skip_rest;
	}else{
	    deck.addh(*nn);
	    //NaPrintLog("$$$ NaPNNNUnit::push_nn() nn: $$$\n");
	    //nn->PrintLog();
	    //NaPrintLog("$$$ NaPNNNUnit::push_nn() deck: $$$\n");
	    //deck(deck.count()-1).PrintLog();
	}
    } else {
	// do nothing?
    }
    if(is_verbose())
	NaPrintLog("NaPNNNUnit::push_nn(%p, %s[%s]) --> %u items stored\n",
		   this, name(), nn->GetInstance(), deck.count());
}